

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

ServiceDescriptor * perfetto::protos::gen::ProducerPort::NewDescriptor(void)

{
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  *this;
  pointer *ppMVar1;
  iterator iVar2;
  ServiceDescriptor *pSVar3;
  Method local_30;
  
  pSVar3 = (ServiceDescriptor *)operator_new(0x20);
  pSVar3->service_name = (char *)0x0;
  (pSVar3->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar3->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar3->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar3->service_name = "ProducerPort";
  this = &pSVar3->methods;
  local_30.name = "InitializeConnection";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::InitializeConnectionRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::InitializeConnectionResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::InitializeConnectionRequest,_perfetto::protos::gen::InitializeConnectionResponse,_&perfetto::protos::gen::ProducerPort::InitializeConnection>
  ;
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::InitializeConnectionResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::InitializeConnectionRequest,_perfetto::protos::gen::InitializeConnectionResponse,_&perfetto::protos::gen::ProducerPort::InitializeConnection>
    ;
    (iVar2._M_current)->name = "InitializeConnection";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::InitializeConnectionRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "RegisterDataSource";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterDataSourceRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterDataSourceResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::RegisterDataSourceRequest,_perfetto::protos::gen::RegisterDataSourceResponse,_&perfetto::protos::gen::ProducerPort::RegisterDataSource>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::RegisterDataSourceResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::RegisterDataSourceRequest,_perfetto::protos::gen::RegisterDataSourceResponse,_&perfetto::protos::gen::ProducerPort::RegisterDataSource>
    ;
    (iVar2._M_current)->name = "RegisterDataSource";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::RegisterDataSourceRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "UnregisterDataSource";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterDataSourceRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterDataSourceResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UnregisterDataSourceRequest,_perfetto::protos::gen::UnregisterDataSourceResponse,_&perfetto::protos::gen::ProducerPort::UnregisterDataSource>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::UnregisterDataSourceResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UnregisterDataSourceRequest,_perfetto::protos::gen::UnregisterDataSourceResponse,_&perfetto::protos::gen::ProducerPort::UnregisterDataSource>
    ;
    (iVar2._M_current)->name = "UnregisterDataSource";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::UnregisterDataSourceRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "CommitData";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::CommitDataRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::CommitDataResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::CommitDataRequest,_perfetto::protos::gen::CommitDataResponse,_&perfetto::protos::gen::ProducerPort::CommitData>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::CommitDataResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::CommitDataRequest,_perfetto::protos::gen::CommitDataResponse,_&perfetto::protos::gen::ProducerPort::CommitData>
    ;
    (iVar2._M_current)->name = "CommitData";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::CommitDataRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "GetAsyncCommand";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetAsyncCommandRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetAsyncCommandResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::GetAsyncCommandRequest,_perfetto::protos::gen::GetAsyncCommandResponse,_&perfetto::protos::gen::ProducerPort::GetAsyncCommand>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::GetAsyncCommandResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::GetAsyncCommandRequest,_perfetto::protos::gen::GetAsyncCommandResponse,_&perfetto::protos::gen::ProducerPort::GetAsyncCommand>
    ;
    (iVar2._M_current)->name = "GetAsyncCommand";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::GetAsyncCommandRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "RegisterTraceWriter";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterTraceWriterRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterTraceWriterResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::RegisterTraceWriterRequest,_perfetto::protos::gen::RegisterTraceWriterResponse,_&perfetto::protos::gen::ProducerPort::RegisterTraceWriter>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::RegisterTraceWriterResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::RegisterTraceWriterRequest,_perfetto::protos::gen::RegisterTraceWriterResponse,_&perfetto::protos::gen::ProducerPort::RegisterTraceWriter>
    ;
    (iVar2._M_current)->name = "RegisterTraceWriter";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::RegisterTraceWriterRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "UnregisterTraceWriter";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterTraceWriterRequest>
  ;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterTraceWriterResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UnregisterTraceWriterRequest,_perfetto::protos::gen::UnregisterTraceWriterResponse,_&perfetto::protos::gen::ProducerPort::UnregisterTraceWriter>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::UnregisterTraceWriterResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UnregisterTraceWriterRequest,_perfetto::protos::gen::UnregisterTraceWriterResponse,_&perfetto::protos::gen::ProducerPort::UnregisterTraceWriter>
    ;
    (iVar2._M_current)->name = "UnregisterTraceWriter";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::UnregisterTraceWriterRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "NotifyDataSourceStarted";
  local_30.request_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedRequest>;
  local_30.reply_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::NotifyDataSourceStartedRequest,_perfetto::protos::gen::NotifyDataSourceStartedResponse,_&perfetto::protos::gen::ProducerPort::NotifyDataSourceStarted>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::NotifyDataSourceStartedRequest,_perfetto::protos::gen::NotifyDataSourceStartedResponse,_&perfetto::protos::gen::ProducerPort::NotifyDataSourceStarted>
    ;
    (iVar2._M_current)->name = "NotifyDataSourceStarted";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "NotifyDataSourceStopped";
  local_30.request_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStoppedRequest>;
  local_30.reply_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStoppedResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::NotifyDataSourceStoppedRequest,_perfetto::protos::gen::NotifyDataSourceStoppedResponse,_&perfetto::protos::gen::ProducerPort::NotifyDataSourceStopped>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStoppedResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::NotifyDataSourceStoppedRequest,_perfetto::protos::gen::NotifyDataSourceStoppedResponse,_&perfetto::protos::gen::ProducerPort::NotifyDataSourceStopped>
    ;
    (iVar2._M_current)->name = "NotifyDataSourceStopped";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStoppedRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "ActivateTriggers";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ActivateTriggersRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ActivateTriggersResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::ActivateTriggersRequest,_perfetto::protos::gen::ActivateTriggersResponse,_&perfetto::protos::gen::ProducerPort::ActivateTriggers>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ActivateTriggersResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::ActivateTriggersRequest,_perfetto::protos::gen::ActivateTriggersResponse,_&perfetto::protos::gen::ProducerPort::ActivateTriggers>
    ;
    (iVar2._M_current)->name = "ActivateTriggers";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ActivateTriggersRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "Sync";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SyncRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SyncResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::SyncRequest,_perfetto::protos::gen::SyncResponse,_&perfetto::protos::gen::ProducerPort::Sync>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SyncResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::SyncRequest,_perfetto::protos::gen::SyncResponse,_&perfetto::protos::gen::ProducerPort::Sync>
    ;
    (iVar2._M_current)->name = "Sync";
    (iVar2._M_current)->request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SyncRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "UpdateDataSource";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UpdateDataSourceRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UpdateDataSourceResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UpdateDataSourceRequest,_perfetto::protos::gen::UpdateDataSourceResponse,_&perfetto::protos::gen::ProducerPort::UpdateDataSource>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::UpdateDataSourceResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UpdateDataSourceRequest,_perfetto::protos::gen::UpdateDataSourceResponse,_&perfetto::protos::gen::ProducerPort::UpdateDataSource>
    ;
    (iVar2._M_current)->name = "UpdateDataSource";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::UpdateDataSourceRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  if ((pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>,_true>
    ::_S_do_it(this);
  }
  return pSVar3;
}

Assistant:

::perfetto::ipc::ServiceDescriptor* ProducerPort::NewDescriptor() {
  auto* desc = new ::perfetto::ipc::ServiceDescriptor();
  desc->service_name = "ProducerPort";

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "InitializeConnection",
     &_IPC_Decoder<InitializeConnectionRequest>,
     &_IPC_Decoder<InitializeConnectionResponse>,
     &_IPC_Invoker<ProducerPort, InitializeConnectionRequest, InitializeConnectionResponse, &ProducerPort::InitializeConnection>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "RegisterDataSource",
     &_IPC_Decoder<RegisterDataSourceRequest>,
     &_IPC_Decoder<RegisterDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, RegisterDataSourceRequest, RegisterDataSourceResponse, &ProducerPort::RegisterDataSource>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UnregisterDataSource",
     &_IPC_Decoder<UnregisterDataSourceRequest>,
     &_IPC_Decoder<UnregisterDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, UnregisterDataSourceRequest, UnregisterDataSourceResponse, &ProducerPort::UnregisterDataSource>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "CommitData",
     &_IPC_Decoder<CommitDataRequest>,
     &_IPC_Decoder<CommitDataResponse>,
     &_IPC_Invoker<ProducerPort, CommitDataRequest, CommitDataResponse, &ProducerPort::CommitData>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "GetAsyncCommand",
     &_IPC_Decoder<GetAsyncCommandRequest>,
     &_IPC_Decoder<GetAsyncCommandResponse>,
     &_IPC_Invoker<ProducerPort, GetAsyncCommandRequest, GetAsyncCommandResponse, &ProducerPort::GetAsyncCommand>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "RegisterTraceWriter",
     &_IPC_Decoder<RegisterTraceWriterRequest>,
     &_IPC_Decoder<RegisterTraceWriterResponse>,
     &_IPC_Invoker<ProducerPort, RegisterTraceWriterRequest, RegisterTraceWriterResponse, &ProducerPort::RegisterTraceWriter>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UnregisterTraceWriter",
     &_IPC_Decoder<UnregisterTraceWriterRequest>,
     &_IPC_Decoder<UnregisterTraceWriterResponse>,
     &_IPC_Invoker<ProducerPort, UnregisterTraceWriterRequest, UnregisterTraceWriterResponse, &ProducerPort::UnregisterTraceWriter>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "NotifyDataSourceStarted",
     &_IPC_Decoder<NotifyDataSourceStartedRequest>,
     &_IPC_Decoder<NotifyDataSourceStartedResponse>,
     &_IPC_Invoker<ProducerPort, NotifyDataSourceStartedRequest, NotifyDataSourceStartedResponse, &ProducerPort::NotifyDataSourceStarted>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "NotifyDataSourceStopped",
     &_IPC_Decoder<NotifyDataSourceStoppedRequest>,
     &_IPC_Decoder<NotifyDataSourceStoppedResponse>,
     &_IPC_Invoker<ProducerPort, NotifyDataSourceStoppedRequest, NotifyDataSourceStoppedResponse, &ProducerPort::NotifyDataSourceStopped>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ActivateTriggers",
     &_IPC_Decoder<ActivateTriggersRequest>,
     &_IPC_Decoder<ActivateTriggersResponse>,
     &_IPC_Invoker<ProducerPort, ActivateTriggersRequest, ActivateTriggersResponse, &ProducerPort::ActivateTriggers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Sync",
     &_IPC_Decoder<SyncRequest>,
     &_IPC_Decoder<SyncResponse>,
     &_IPC_Invoker<ProducerPort, SyncRequest, SyncResponse, &ProducerPort::Sync>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UpdateDataSource",
     &_IPC_Decoder<UpdateDataSourceRequest>,
     &_IPC_Decoder<UpdateDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, UpdateDataSourceRequest, UpdateDataSourceResponse, &ProducerPort::UpdateDataSource>});
  desc->methods.shrink_to_fit();
  return desc;
}